

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapping.c
# Opt level: O0

void memory_mapping_list_add_merge_sorted_x86_64
               (MemoryMappingList *list,hwaddr phys_addr,hwaddr virt_addr,ram_addr_t length)

{
  MemoryMapping *map;
  _Bool _Var1;
  MemoryMapping *last_mapping;
  MemoryMapping *memory_mapping;
  ram_addr_t length_local;
  hwaddr virt_addr_local;
  hwaddr phys_addr_local;
  MemoryMappingList *list_local;
  
  if ((list->head).tqh_first == (MemoryMapping *)0x0) {
    create_new_memory_mapping(list,phys_addr,virt_addr,length);
  }
  else {
    map = list->last_mapping;
    if ((map == (MemoryMapping *)0x0) ||
       (_Var1 = mapping_contiguous(map,phys_addr,virt_addr), !_Var1)) {
      for (last_mapping = (list->head).tqh_first; last_mapping != (MemoryMapping *)0x0;
          last_mapping = (last_mapping->next).tqe_next) {
        _Var1 = mapping_contiguous(last_mapping,phys_addr,virt_addr);
        if (_Var1) {
          last_mapping->length = length + last_mapping->length;
          list->last_mapping = last_mapping;
          return;
        }
        if (phys_addr + length < last_mapping->phys_addr) break;
        _Var1 = mapping_have_same_region(last_mapping,phys_addr,length);
        if ((_Var1) && (_Var1 = mapping_conflict(last_mapping,phys_addr,virt_addr), !_Var1)) {
          mapping_merge(last_mapping,virt_addr,length);
          list->last_mapping = last_mapping;
          return;
        }
      }
      create_new_memory_mapping(list,phys_addr,virt_addr,length);
    }
    else {
      map->length = length + map->length;
    }
  }
  return;
}

Assistant:

void memory_mapping_list_add_merge_sorted(MemoryMappingList *list,
                                          hwaddr phys_addr,
                                          hwaddr virt_addr,
                                          ram_addr_t length)
{
    MemoryMapping *memory_mapping, *last_mapping;

    if (QTAILQ_EMPTY(&list->head)) {
        create_new_memory_mapping(list, phys_addr, virt_addr, length);
        return;
    }

    last_mapping = list->last_mapping;
    if (last_mapping) {
        if (mapping_contiguous(last_mapping, phys_addr, virt_addr)) {
            last_mapping->length += length;
            return;
        }
    }

    QTAILQ_FOREACH(memory_mapping, &list->head, next) {
        if (mapping_contiguous(memory_mapping, phys_addr, virt_addr)) {
            memory_mapping->length += length;
            list->last_mapping = memory_mapping;
            return;
        }

        if (phys_addr + length < memory_mapping->phys_addr) {
            /* create a new region before memory_mapping */
            break;
        }

        if (mapping_have_same_region(memory_mapping, phys_addr, length)) {
            if (mapping_conflict(memory_mapping, phys_addr, virt_addr)) {
                continue;
            }

            /* merge this region into memory_mapping */
            mapping_merge(memory_mapping, virt_addr, length);
            list->last_mapping = memory_mapping;
            return;
        }
    }

    /* this region can not be merged into any existed memory mapping. */
    create_new_memory_mapping(list, phys_addr, virt_addr, length);
}